

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlDataModel.c
# Opt level: O0

uint32_t JlGetListCount(JlDataObject *ListObject)

{
  uint32_t local_14;
  uint32_t count;
  JlDataObject *ListObject_local;
  
  local_14 = 0;
  if ((ListObject != (JlDataObject *)0x0) && (ListObject->Type == JL_DATA_TYPE_LIST)) {
    local_14 = (ListObject->field_2).List.Count;
  }
  return local_14;
}

Assistant:

uint32_t
    JlGetListCount
    (
        JlDataObject const*         ListObject
    )
{
    uint32_t count = 0;

    if( NULL != ListObject )
    {
        if( JL_DATA_TYPE_LIST == ListObject->Type )
        {
            count = ListObject->List.Count;
        }
        // else: Not a list
    } // else: Invalid parameter

    return count;
}